

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

int wstran_dialer_init(void *arg,nng_url *url,nni_dialer *ndialer)

{
  uint16_t uVar1;
  int iVar2;
  nni_sock *sock;
  char *pcVar3;
  nng_stream_dialer **dp;
  char local_68 [8];
  char name [64];
  
  sock = nni_dialer_sock(ndialer);
  nni_mtx_init((nni_mtx *)((long)arg + 0x20));
  nni_aio_list_init((nni_list *)((long)arg + 8));
  nni_aio_init((nni_aio *)((long)arg + 0x48),wstran_connect_cb,arg);
  uVar1 = nni_sock_peer_id(sock);
  *(uint16_t *)arg = uVar1;
  *(nni_dialer **)((long)arg + 0x218) = ndialer;
  pcVar3 = nni_sock_peer_name(sock);
  snprintf(local_68,0x40,"%s.sp.nanomsg.org",pcVar3);
  dp = (nng_stream_dialer **)((long)arg + 0x210);
  iVar2 = nni_ws_dialer_alloc(dp,url);
  if (iVar2 == 0) {
    iVar2 = nng_stream_dialer_set_bool(*dp,"ws:msgmode",true);
    if (iVar2 == 0) {
      iVar2 = nng_stream_dialer_set_string(*dp,"ws:protocol",local_68);
    }
  }
  return iVar2;
}

Assistant:

static int
wstran_dialer_init(void *arg, nng_url *url, nni_dialer *ndialer)
{
	ws_dialer *d = arg;
	nni_sock  *s = nni_dialer_sock(ndialer);
	int        rv;
	char       name[64];

	nni_mtx_init(&d->mtx);

	nni_aio_list_init(&d->aios);
	nni_aio_init(&d->connaio, wstran_connect_cb, d);

	d->peer    = nni_sock_peer_id(s);
	d->ndialer = ndialer;

	snprintf(
	    name, sizeof(name), "%s.sp.nanomsg.org", nni_sock_peer_name(s));

	if (((rv = nni_ws_dialer_alloc(&d->dialer, url)) != 0) ||
	    ((rv = nng_stream_dialer_set_bool(
	          d->dialer, NNI_OPT_WS_MSGMODE, true)) != 0) ||
	    ((rv = nng_stream_dialer_set_string(
	          d->dialer, NNG_OPT_WS_PROTOCOL, name)) != 0)) {
		return (rv);
	}

	return (0);
}